

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void __thiscall VBW::ConvexCell::kill_vertex(ConvexCell *this,index_t v)

{
  index_t iVar1;
  Triangle TVar2;
  TriangleWithFlags *pTVar3;
  undefined4 local_1e;
  ushort local_1a;
  uint uStack_18;
  Triangle T;
  index_t t;
  index_t v_local;
  ConvexCell *this_local;
  
  uStack_18 = 0;
  while( true ) {
    iVar1 = nb_t(this);
    if (iVar1 <= uStack_18) break;
    TVar2 = get_triangle(this,uStack_18);
    local_1e = TVar2._0_4_;
    local_1a = TVar2.k;
    if ((local_1e & 0xffff) == v) {
      local_1e = local_1e & 0xffff0000;
    }
    if (local_1e >> 0x10 == v) {
      local_1e = local_1e & 0xffff;
    }
    if (local_1a == v) {
      local_1a = 0;
    }
    pTVar3 = GEO::vector<VBW::TriangleWithFlags>::operator[](&this->t_,uStack_18);
    (pTVar3->super_Triangle).i = (ushort)local_1e;
    pTVar3 = GEO::vector<VBW::TriangleWithFlags>::operator[](&this->t_,uStack_18);
    (pTVar3->super_Triangle).j = local_1e._2_2_;
    pTVar3 = GEO::vector<VBW::TriangleWithFlags>::operator[](&this->t_,uStack_18);
    (pTVar3->super_Triangle).k = local_1a;
    uStack_18 = uStack_18 + 1;
  }
  return;
}

Assistant:

void ConvexCell::kill_vertex(index_t v) {
	for(index_t t=0; t<nb_t(); ++t) {
	    Triangle T = get_triangle(t);
	    if(T.i == v) {
		T.i = VERTEX_AT_INFINITY;
	    }
	    if(T.j == v) {
		T.j = VERTEX_AT_INFINITY;
	    }
	    if(T.k == v) {
		T.k = VERTEX_AT_INFINITY;
	    }
	    t_[t].i = T.i;
	    t_[t].j = T.j;
	    t_[t].k = T.k;	    
	}
    }